

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::begin_slider_animation(Plotter *this,size_t idx)

{
  rep rVar1;
  pointer pSVar2;
  size_t local_20;
  
  pSVar2 = (this->sliders).
           super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar2[idx].animation_dir == 0) {
    local_20 = idx;
    if ((this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->animating_sliders).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      rVar1 = std::chrono::_V2::system_clock::now();
      (this->slider_animation_prev_time).__d.__r = rVar1;
      pSVar2 = (this->sliders).
               super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>._M_impl
               .super__Vector_impl_data._M_start;
    }
    pSVar2[idx].animation_dir = 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->animating_sliders,&local_20);
    this->require_update = true;
  }
  return;
}

Assistant:

void Plotter::begin_slider_animation(size_t idx) {
    if (sliders[idx].animation_dir == 0) {
        if (animating_sliders.empty()) {
            slider_animation_prev_time =
                std::chrono::high_resolution_clock::now();
        }
        sliders[idx].animation_dir = 1;
        animating_sliders.push_back(idx);
        require_update = true;
    }
}